

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType re,RealType alpha,RealType beta,
          RealType A,RealType B,RealType kappa,RealType lambda)

{
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *this_00;
  undefined8 *puVar1;
  RealType RVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int i;
  int iVar6;
  pair<double,_double> pVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int atid2;
  int atid1;
  CubicSplinePtr cs;
  vector<double,_std::allocator<double>_> phiVals;
  vector<double,_std::allocator<double>_> rVals;
  RealType r;
  EAMInteractionData mixer;
  int local_13c;
  double local_138;
  double local_130;
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *local_128;
  double local_120;
  CubicSpline *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  double local_c8;
  AtomType *local_c0;
  AtomType *local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  double local_80;
  CubicSpline *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 local_40;
  
  iVar6 = 0;
  local_118 = (CubicSpline *)0x0;
  local_138 = re;
  local_c0 = atype2;
  local_b8 = atype1;
  local_b0 = alpha;
  local_a8 = beta;
  local_a0 = A;
  local_98 = B;
  local_90 = kappa;
  local_88 = lambda;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
            (&local_110,&local_118,(allocator<OpenMD::CubicSpline> *)&local_78);
  local_58 = 0;
  uStack_50 = 0;
  uStack_4f = 0;
  local_68 = 0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = (CubicSpline *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_80 = local_138 * 4.0;
  if (local_80 <= 9.0) {
    local_80 = 9.0;
  }
  if (12.0 <= local_80) {
    local_80 = 12.0;
  }
  local_80 = local_80 / 1999.0;
  do {
    local_c8 = (double)iVar6 * local_80;
    if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_c8);
    }
    else {
      *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_c8;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_128 = (vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                 *)local_c8;
    local_120 = PhiCoreCore(this,local_c8,local_138,local_a0,local_b0,local_90);
    RVar2 = PhiCoreValence(this,(RealType)local_128,local_138,local_98,local_a8,local_88);
    local_130 = RVar2 + local_120;
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_130);
    }
    else {
      *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = local_130;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 2000);
  CubicSpline::addPoints(local_118,&local_e8,&local_108);
  local_78 = local_118;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,&local_110);
  pVar7 = CubicSpline::getLimits(local_78);
  local_48 = pVar7.second._0_1_;
  uStack_47 = pVar7.second._1_7_;
  local_40 = 1;
  iVar6 = AtomType::getIdent(local_b8);
  local_130 = (double)CONCAT44(local_130._4_4_,iVar6);
  local_13c = AtomType::getIdent(local_c0);
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,(int *)&local_130);
  if (pVar8.second == false) {
    iVar6 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_130._0_4_];
  }
  else {
    iVar6 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_130._0_4_] = iVar6;
    this->nEAM_ = this->nEAM_ + 1;
  }
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_13c);
  if (pVar8.second == false) {
    iVar4 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_13c];
  }
  else {
    iVar4 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_13c] = iVar4;
    this->nEAM_ = this->nEAM_ + 1;
  }
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(this_00,(long)this->nEAM_);
  lVar3 = (long)iVar6;
  local_120 = (double)lVar3;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar3,(long)this->nEAM_);
  lVar5 = (long)iVar4;
  lVar3 = *(long *)&(this_00->
                    super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar3].
                    super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  local_138 = (double)CONCAT44(local_138._4_4_,iVar6);
  puVar1 = (undefined8 *)(lVar3 + lVar5 * 0x40);
  *puVar1 = local_78;
  local_128 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&_Stack_70);
  puVar1[2] = local_68;
  lVar3 = lVar3 + lVar5 * 0x40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x18),&_Stack_60);
  *(undefined8 *)(lVar3 + 0x20) = local_58;
  *(ulong *)(lVar3 + 0x28) = CONCAT71(uStack_4f,uStack_50);
  *(ulong *)(lVar3 + 0x29) = CONCAT17(local_48,uStack_4f);
  *(ulong *)(lVar3 + 0x31) = CONCAT17(local_40,uStack_47);
  if (iVar4 != local_138._0_4_) {
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)this->nEAM_);
    lVar3 = *(long *)&(local_128->
                      super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar5].
                      super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar5 = (long)local_120 * 0x40;
    puVar1 = (undefined8 *)(lVar3 + lVar5);
    *puVar1 = local_78;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&_Stack_70);
    puVar1[2] = local_68;
    lVar3 = lVar3 + lVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x18),&_Stack_60);
    *(undefined8 *)(lVar3 + 0x20) = local_58;
    *(ulong *)(lVar3 + 0x28) = CONCAT71(uStack_4f,uStack_50);
    *(ulong *)(lVar3 + 0x29) = CONCAT17(local_48,uStack_4f);
    *(ulong *)(lVar3 + 0x31) = CONCAT17(local_40,uStack_47);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
  }
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType re, RealType alpha, RealType beta,
                                   RealType A, RealType B, RealType kappa,
                                   RealType lambda) {
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    EAMInteractionData mixer;
    std::vector<RealType> rVals;
    std::vector<RealType> phiVals;
    std::vector<RealType> jVals;

    int Nr = 2000;
    RealType r;

    // default to FCC if we don't specify HCP or BCC:
    // RealType rcut = sqrt(5.0) * re;
    RealType rcut = std::min(12.0, std::max(9.0, 4.0 * re));
    RealType dr   = rcut / (RealType)(Nr - 1);

    for (int i = 0; i < Nr; i++) {
      r = RealType(i) * dr;
      rVals.push_back(r);
      phiVals.push_back(Phi(r, re, A, B, alpha, beta, kappa, lambda));
    }
    cs->addPoints(rVals, phiVals);
    mixer.phi           = cs;
    mixer.rcut          = mixer.phi->getLimits().second;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;
    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }